

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::UnusedTopBlockVisitor::visit(UnusedTopBlockVisitor *this,Generator *generator)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  long lVar5;
  _Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  local_78;
  undefined1 local_40 [8];
  shared_ptr<kratos::Stmt> stmt;
  
  p_Var1 = &local_78._M_impl.super__Rb_tree_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar4 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = &p_Var1->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar5 = 0;
    do {
      Generator::get_stmt((Generator *)local_40,(uint32_t)generator);
      if ((*(int *)((long)local_40 + 0x78) == 4) &&
         (lVar2 = __dynamic_cast(local_40,&Stmt::typeinfo,&StmtBlock::typeinfo,0),
         *(long *)(lVar2 + 0xc0) == *(long *)(lVar2 + 200))) {
        std::
        _Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
        ::_M_emplace_unique<std::shared_ptr<kratos::Stmt>&>
                  ((_Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&local_78,(shared_ptr<kratos::Stmt> *)local_40);
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar5 = lVar5 + 1;
      p_Var3 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  for (; (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    Generator::remove_stmt(generator,(shared_ptr<kratos::Stmt> *)(p_Var3 + 1));
  }
  std::
  _Rb_tree<std::shared_ptr<kratos::Stmt>,_std::shared_ptr<kratos::Stmt>,_std::_Identity<std::shared_ptr<kratos::Stmt>_>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::~_Rb_tree(&local_78);
  return;
}

Assistant:

void visit(Generator* generator) override {
        std::set<std::shared_ptr<Stmt>> blocks_to_remove = {};
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto* block = dynamic_cast<StmtBlock*>(stmt.get());
                if (block->empty()) blocks_to_remove.emplace(stmt);
            }
        }

        for (auto const& stmt : blocks_to_remove) {
            generator->remove_stmt(stmt);
        }
    }